

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O1

void __thiscall
QNetworkReplyImplPrivate::appendDownstreamDataSignalEmissions(QNetworkReplyImplPrivate *this)

{
  QNetworkReply *this_00;
  char cVar1;
  long lVar2;
  long lVar3;
  _Storage<long_long,_true> _t2;
  long in_FS_OFFSET;
  QByteArrayView value;
  QByteArrayView QVar4;
  optional<long_long> oVar5;
  pair<QByteArray,_QByteArray> *local_30;
  
  local_30 = *(pair<QByteArray,_QByteArray> **)(in_FS_OFFSET + 0x28);
  this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
  QNetworkHeadersPrivate::headers((QNetworkHeadersPrivate *)&stack0xffffffffffffffc8);
  QVar4 = QHttpHeaders::value((QHttpHeaders *)&stack0xffffffffffffffc8,ContentLength,
                              (QByteArrayView)ZEXT816(0));
  value.m_data = QVar4.m_data;
  value.m_size = (qsizetype)value.m_data;
  oVar5 = QNetworkHeadersPrivate::toInt((QNetworkHeadersPrivate *)QVar4.m_size,value);
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&stack0xffffffffffffffc8);
  this->notificationHandlingPaused = true;
  QIODevice::readyRead();
  cVar1 = QElapsedTimer::isValid();
  if (cVar1 != '\0') {
    lVar2 = QElapsedTimer::elapsed();
    if (99 < lVar2) {
      QElapsedTimer::start();
      _t2._M_value = -1;
      if (((undefined1  [16])
           oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0
         ) {
        _t2._M_value = oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
                       super__Optional_payload_base<long_long>._M_payload;
      }
      QNetworkReply::downloadProgress(this_00,this->bytesDownloaded,_t2._M_value);
    }
  }
  resumeNotificationHandling(this);
  lVar2 = (this->super_QNetworkReplyPrivate).readBufferMaxSize;
  if (lVar2 != 0) {
    lVar3 = *(long *)&(this->super_QNetworkReplyPrivate).field_0x90;
    if (lVar3 == 0) {
      lVar3 = 0;
    }
    else {
      lVar3 = *(long *)(lVar3 + 0x18);
    }
    if (lVar2 <= lVar3) goto LAB_0019ae1e;
  }
  backendNotify(this,NotifyDownstreamReadyWrite);
LAB_0019ae1e:
  if (*(pair<QByteArray,_QByteArray> **)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::appendDownstreamDataSignalEmissions()
{
    Q_Q(QNetworkReplyImpl);

    const auto totalSizeOpt = QNetworkHeadersPrivate::toInt(
            headers().value(QHttpHeaders::WellKnownHeader::ContentLength));
    pauseNotificationHandling();
    // important: At the point of this readyRead(), the data parameter list must be empty,
    // else implicit sharing will trigger memcpy when the user is reading data!
    emit q->readyRead();
    // emit readyRead before downloadProgress in case this will cause events to be
    // processed and we get into a recursive call (as in QProgressDialog).
    if (downloadProgressSignalChoke.isValid() &&
        downloadProgressSignalChoke.elapsed() >= progressSignalInterval) {
        downloadProgressSignalChoke.start();
        emit q->downloadProgress(bytesDownloaded, totalSizeOpt.value_or(-1));
    }

    resumeNotificationHandling();
    // do we still have room in the buffer?
    if (nextDownstreamBlockSize() > 0)
        backendNotify(QNetworkReplyImplPrivate::NotifyDownstreamReadyWrite);
}